

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

string * __thiscall
testing::internal::
FormatForComparisonFailureMessage<TApp_NewEnumTest_Test::TestBody()::Level2,TApp_NewEnumTest_Test::TestBody()::Level2>
          (string *__return_storage_ptr__,internal *this,Level2 *value,Level2 *param_2)

{
  Level2 *param_1_local;
  Level2 *value_local;
  
  FormatForComparison<TApp_NewEnumTest_Test::TestBody()::Level2,TApp_NewEnumTest_Test::TestBody()::Level2>
  ::Format_abi_cxx11_(__return_storage_ptr__,
                      (FormatForComparison<TApp_NewEnumTest_Test::TestBody()::Level2,TApp_NewEnumTest_Test::TestBody()::Level2>
                       *)this,value);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatForComparisonFailureMessage(
    const T1& value, const T2& /* other_operand */) {
  return FormatForComparison<T1, T2>::Format(value);
}